

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_type_demo.cpp
# Opt level: O0

void PointerTypeGraphDemo(void)

{
  bool bVar1;
  StateExample *this;
  reference ppSVar2;
  reference ppSVar3;
  StateExample *e_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *__range1_1;
  _List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>
  *e;
  iterator __end1;
  iterator __begin1;
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
  *__range1;
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
  all_edges;
  Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  graph_ptr;
  int i;
  vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> nodes;
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
  *in_stack_fffffffffffffde8;
  vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>
  *in_stack_fffffffffffffdf0;
  vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *this_00;
  Edge *this_01;
  Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_> *this_02
  ;
  double in_stack_fffffffffffffe18;
  value_type trans;
  StateExample *in_stack_fffffffffffffe20;
  vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *this_03;
  StateExample *in_stack_fffffffffffffe28;
  value_type sstate;
  Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  *in_stack_fffffffffffffe30;
  Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_> *this_04
  ;
  Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_> *this_05
  ;
  __normal_iterator<xmotion::StateExample_**,_std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>_>
  local_c0;
  undefined1 *local_b8;
  reference local_b0;
  _List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>
  *local_a8;
  __normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>_>
  local_a0;
  undefined1 *local_98;
  undefined1 local_90 [104];
  StateExample *local_28;
  int local_1c;
  
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::vector
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)0x103d54);
  for (local_1c = 0; local_1c < 9; local_1c = local_1c + 1) {
    this = (StateExample *)operator_new(8);
    xmotion::StateExample::StateExample(this,(long)local_1c);
    local_28 = this;
    std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::push_back
              (in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
  }
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::Graph((Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
           *)0x103e28);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,0);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,1);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,0);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,3);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,1);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,0);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,1);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,4);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,1);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,2);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,2);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,1);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,2);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,5);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,3);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,0);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,3);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,4);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,4);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,1);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,4);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,3);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,4);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,5);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,5);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,2);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  ppSVar2 = std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::
            operator[]((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
                       &stack0xffffffffffffffe8,5);
  this_05 = (Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
             *)*ppSVar2;
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             &stack0xffffffffffffffe8,4);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
            in_stack_fffffffffffffe18);
  this_04 = (Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
             *)&stack0xffffffffffffffe8;
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)this_04,5)
  ;
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)this_04,8)
  ;
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(this_04,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  this_03 = (vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
            &stack0xffffffffffffffe8;
  ppSVar2 = std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::
            operator[](this_03,7);
  sstate = *ppSVar2;
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            (this_03,4);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(this_04,sstate,(StateExample *)this_03,in_stack_fffffffffffffe18);
  this_02 = (Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
             *)&stack0xffffffffffffffe8;
  ppSVar2 = std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::
            operator[]((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
                       this_02,7);
  trans = *ppSVar2;
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)this_02,8)
  ;
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(this_04,sstate,(StateExample *)this_03,(double)trans);
  this_01 = (Edge *)&stack0xffffffffffffffe8;
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)this_01,8)
  ;
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)this_01,5)
  ;
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(this_04,sstate,(StateExample *)this_03,(double)trans);
  this_00 = (vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
            &stack0xffffffffffffffe8;
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            (this_00,8);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::operator[]
            (this_00,7);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::AddEdge(this_04,sstate,(StateExample *)this_03,(double)trans);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::GetAllEdges(this_05);
  local_98 = local_90;
  local_a0._M_current =
       (_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>
        *)std::
          vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
          ::begin(in_stack_fffffffffffffde8);
  local_a8 = (_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>
              *)std::
                vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
                ::end(in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>_>
                        *)this_00,
                       (__normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) break;
    local_b0 = __gnu_cxx::
               __normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>_>
               ::operator*(&local_a0);
    std::
    _List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>
    ::operator->((_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>
                  *)0x1044f3);
    xmotion::
    Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge
    ::PrintEdge(this_01);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>_>
    ::operator++(&local_a0);
  }
  local_b8 = &stack0xffffffffffffffe8;
  local_c0._M_current =
       (StateExample **)
       std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::begin
                 ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
                  in_stack_fffffffffffffde8);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::end
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)
             in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmotion::StateExample_**,_std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>_>
                        *)this_00,
                       (__normal_iterator<xmotion::StateExample_**,_std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<xmotion::StateExample_**,_std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>_>
              ::operator*(&local_c0);
    in_stack_fffffffffffffde8 =
         (vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
          *)*ppSVar3;
    if (in_stack_fffffffffffffde8 !=
        (vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
         *)0x0) {
      operator_delete(in_stack_fffffffffffffde8);
    }
    __gnu_cxx::
    __normal_iterator<xmotion::StateExample_**,_std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>_>
    ::operator++(&local_c0);
  }
  std::
  vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
  ::~vector((vector<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>::Edge>_>_>
             *)this_01);
  xmotion::Graph<xmotion::StateExample_*,_double,_xmotion::DefaultIndexer<xmotion::StateExample_*>_>
  ::~Graph(this_02);
  std::vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_>::~vector
            ((vector<xmotion::StateExample_*,_std::allocator<xmotion::StateExample_*>_> *)this_01);
  return;
}

Assistant:

void PointerTypeGraphDemo() {
  std::vector<StateExample *> nodes;

  // create nodes
  for (int i = 0; i < 9; i++) {
    nodes.push_back(new StateExample(i));
  }

  // create a graph
  Graph<StateExample *> graph_ptr;

  graph_ptr.AddEdge(nodes[0], nodes[1], 1.0);
  graph_ptr.AddEdge(nodes[0], nodes[3], 1.5);
  graph_ptr.AddEdge(nodes[1], nodes[0], 2.0);
  graph_ptr.AddEdge(nodes[1], nodes[4], 2.5);
  graph_ptr.AddEdge(nodes[1], nodes[2], 1.0);
  graph_ptr.AddEdge(nodes[2], nodes[1], 1.5);
  graph_ptr.AddEdge(nodes[2], nodes[5], 2.0);
  graph_ptr.AddEdge(nodes[3], nodes[0], 2.5);
  graph_ptr.AddEdge(nodes[3], nodes[4], 2.5);
  graph_ptr.AddEdge(nodes[4], nodes[1], 2.5);
  graph_ptr.AddEdge(nodes[4], nodes[3], 2.5);
  graph_ptr.AddEdge(nodes[4], nodes[5], 2.5);
  graph_ptr.AddEdge(nodes[5], nodes[2], 2.5);
  graph_ptr.AddEdge(nodes[5], nodes[4], 2.5);
  graph_ptr.AddEdge(nodes[5], nodes[8], 2.5);
  graph_ptr.AddEdge(nodes[7], nodes[4], 2.5);
  graph_ptr.AddEdge(nodes[7], nodes[8], 2.5);
  graph_ptr.AddEdge(nodes[8], nodes[5], 2.5);
  graph_ptr.AddEdge(nodes[8], nodes[7], 2.5);

  auto all_edges = graph_ptr.GetAllEdges();
  for (auto &e : all_edges) e->PrintEdge();

  // need to delete all nodes, the graph only maintains pointers to these nodes
  for (auto e : nodes) delete e;
}